

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmain.cpp
# Opt level: O0

int vm_get_game_arg(int argc,char **argv,char *buf,size_t buflen,int *engine_type)

{
  char cVar1;
  int iVar2;
  long in_RSI;
  int in_EDI;
  undefined4 *in_R8;
  bool bVar3;
  int i;
  char *restore_file;
  undefined4 in_stack_00000054;
  char *in_stack_00000058;
  ulong in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  int local_34;
  long local_30;
  
  local_30 = 0;
  *in_R8 = 0xfffffffe;
  local_34 = 1;
  while( true ) {
    bVar3 = false;
    if (local_34 < in_EDI) {
      bVar3 = **(char **)(in_RSI + (long)local_34 * 8) == '-';
    }
    if (!bVar3) break;
    in_stack_ffffffffffffffc0 =
         (char *)(ulong)((int)*(char *)(*(long *)(in_RSI + (long)local_34 * 8) + 1) - 0x52);
    switch(in_stack_ffffffffffffffc0) {
    case (char *)0x0:
      if (*(char *)(*(long *)(in_RSI + (long)local_34 * 8) + 2) == '\0') {
        local_34 = local_34 + 1;
      }
      break;
    case (char *)0x6:
      iVar2 = strcmp(*(char **)(in_RSI + (long)local_34 * 8),"-Xinterfaces");
      if (iVar2 == 0) {
        strcpy_limit(in_stack_ffffffffffffffc0,
                     (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     in_stack_ffffffffffffffb0);
        *in_R8 = 3;
        return 1;
      }
      break;
    case (char *)0x10:
      break;
    case (char *)0x11:
      iVar2 = strcmp(*(char **)(in_RSI + (long)local_34 * 8),"-ctab");
      if (((iVar2 == 0) ||
          (iVar2 = strcmp(*(char **)(in_RSI + (long)local_34 * 8),"-cs"), iVar2 == 0)) ||
         (iVar2 = strcmp(*(char **)(in_RSI + (long)local_34 * 8),"-csl"), iVar2 == 0)) {
        local_34 = local_34 + 1;
      }
      break;
    case (char *)0x12:
      iVar2 = memcmp(*(void **)(in_RSI + (long)local_34 * 8),"-double",7);
      if (((iVar2 != 0) ||
          (((*(char *)(*(long *)(in_RSI + (long)local_34 * 8) + 7) != '\0' &&
            (*(char *)(*(long *)(in_RSI + (long)local_34 * 8) + 7) != '+')) &&
           (*(char *)(*(long *)(in_RSI + (long)local_34 * 8) + 7) != '-')))) &&
         (*(char *)(*(long *)(in_RSI + (long)local_34 * 8) + 2) == '\0')) {
        local_34 = local_34 + 1;
      }
      break;
    case (char *)0x17:
      if (*(char *)(*(long *)(in_RSI + (long)local_34 * 8) + 2) == '\0') {
        local_34 = local_34 + 1;
      }
      break;
    case (char *)0x1a:
      if (*(char *)(*(long *)(in_RSI + (long)local_34 * 8) + 2) == '\0') {
        local_34 = local_34 + 1;
      }
      break;
    case (char *)0x1b:
      cVar1 = *(char *)(*(long *)(in_RSI + (long)local_34 * 8) + 2);
      in_stack_ffffffffffffffbc = (int)cVar1;
      if (cVar1 == '\0') {
        local_34 = local_34 + 1;
      }
      else if (((in_stack_ffffffffffffffbc == 0x68) || (in_stack_ffffffffffffffbc == 0x73)) &&
              (*(char *)(*(long *)(in_RSI + (long)local_34 * 8) + 3) == '\0')) {
        local_34 = local_34 + 1;
      }
      break;
    case (char *)0x1c:
      break;
    case (char *)0x1d:
      if (*(char *)(*(long *)(in_RSI + (long)local_34 * 8) + 2) == '\0') {
        local_34 = local_34 + 1;
      }
      break;
    case (char *)0x1e:
      break;
    case (char *)0x20:
      if (*(char *)(*(long *)(in_RSI + (long)local_34 * 8) + 2) == '\0') {
        local_34 = local_34 + 1;
        local_30 = *(long *)(in_RSI + (long)local_34 * 8);
      }
      else {
        local_30 = *(long *)(in_RSI + (long)local_34 * 8) + 2;
      }
      break;
    case (char *)0x21:
      if (*(char *)(*(long *)(in_RSI + (long)local_34 * 8) + 2) == 'd') {
        local_34 = local_34 + 1;
      }
      else if (*(char *)(*(long *)(in_RSI + (long)local_34 * 8) + 2) == '\0') {
        local_34 = local_34 + 1;
      }
      break;
    case (char *)0x22:
      in_stack_ffffffffffffffb0 =
           (ulong)((int)*(char *)(*(long *)(in_RSI + (long)local_34 * 8) + 2) - 0x66);
      switch(in_stack_ffffffffffffffb0) {
      case 0:
      case 0xd:
        if (*(char *)(*(long *)(in_RSI + (long)local_34 * 8) + 3) == '\0') {
          local_34 = local_34 + 1;
        }
        break;
      default:
        break;
      case 10:
        break;
      case 0x14:
        local_34 = local_34 + 1;
      }
      break;
    case (char *)0x23:
      if (*(char *)(*(long *)(in_RSI + (long)local_34 * 8) + 2) == '\0') {
        local_34 = local_34 + 1;
      }
      break;
    case (char *)0x25:
      iVar2 = strcmp(*(char **)(in_RSI + (long)local_34 * 8),"-webhost");
      if ((iVar2 == 0) ||
         (iVar2 = strcmp(*(char **)(in_RSI + (long)local_34 * 8),"-websid"), iVar2 == 0)) {
        local_34 = local_34 + 1;
      }
    }
    local_34 = local_34 + 1;
  }
  if (local_34 < in_EDI) {
    strcpy_limit(in_stack_ffffffffffffffc0,
                 (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 in_stack_ffffffffffffffb0);
    return 1;
  }
  if (local_30 != 0) {
    iVar2 = vm_get_game_file_from_savefile
                      (in_stack_00000058,(char *)CONCAT44(in_stack_00000054,argc),(size_t)argv);
    return iVar2;
  }
  return 0;
}

Assistant:

int vm_get_game_arg(int argc, const char *const *argv,
                    char *buf, size_t buflen, int *engine_type)
{
    /* presume we won't find a file to restore */
    const char *restore_file = 0;

    /* presume we won't identify the engine type based soley on arguments */
    *engine_type = VM_GGT_INVALID;

    /* 
     *   Scan the arguments for the union of the TADS 2 and TADS 3 command
     *   line options.  Start at the second element of the argument vector,
     *   since the first element is the executable name.  Keep going until
     *   we run out of options, each of which must start with a '-'.
     *   
     *   Note that we don't care about the meanings of the options - we
     *   simply want to skip past them.  This is more complicated than
     *   merely looking for the first argument without a '-' prefix, because
     *   some of the options allow arguments, and an option argument can
     *   sometimes - depending on the argument - take the next position in
     *   the argument vector after the option itself.  So, we must determine
     *   the meaning of each option well enough that we can tell whether or
     *   not the next argv element after the option is part of the option.  
     */
    int i;
    for (i = 1 ; i < argc && argv[i][0] == '-' ; ++i)
    {
        /* 
         *   check the first character after the hyphen to determine which
         *   option we have 
         */
        switch(argv[i][1])
        {
        case 'b':
            /* 
             *   tads 3 "-banner" (no arguments, so just consume it and
             *   continue) 
             */
            break;

        case 'c':
            /* 
             *   tads 3 "-cs charset" or "-csl charset"; tads 2 "-ctab-" or
             *   "-ctab tab" 
             */
            if (strcmp(argv[i], "-ctab") == 0
                || strcmp(argv[i], "-cs") == 0
                || strcmp(argv[i], "-csl") == 0)
            {
                /* there's another argument giving the filename */
                ++i;
            }
            break;

        case 'd':
            /* tads 2 "-double[+-]" (no arguments), tads 3 -d <path> */
            if (memcmp(argv[i], "-double", 7) == 0
                && (argv[i][7] == '\0'
                    || argv[i][7] == '+'
                    || argv[i][7] == '-'))
            {
                /* tads 2 -double - no further arguments */
            }
            else if (argv[i][2] == '\0')
            {
                /* tads 3 -d <path> */
                ++i;
            }
            break;

        case 'm':
            /* tads 2 "-msSize", "-mhSize", "-mSize" */
            switch(argv[i][2])
            {
            case 's':
            case 'h':
                /* 
                 *   argument required - if nothing follows the second
                 *   letter, consume the next vector item as the option
                 *   argument 
                 */
                if (argv[i][3] == '\0')
                    ++i;
                break;

            case '\0':
                /* 
                 *   argument required, but nothing follows the "-m" -
                 *   consume the next vector item 
                 */
                ++i;
                break;

            default:
                /* argument required and present */
                break;
            }
            break;

        case 't':
            /* 
             *   tads 2 "-tfFile", "-tsSize", "-tp[+-]", "-t[+0]"; tads3 "-tz
             *   timezone" 
             */
            switch(argv[i][2])
            {
            case 'f':
            case 's':
                /* 
                 *   argument required - consume the next vector item if
                 *   nothing is attached to this item 
                 */
                if (argv[i][3] == '\0')
                    ++i;
                break;
                
            case 'p':
                /* no arguments */
                break;

            case 'z':
                /* -tz - one argument required */
                ++i;
                break;

            default:
                /* no arguments */
                break;
            }
            break;

        case 'u':
            /* 
             *   tads 2 "-uSize" - argument required, so consume the next
             *   vector item if necessary 
             */
            if (argv[i][2] == '\0')
                ++i;
            break;

        case 'n':
            /* 
             *   tads3 "-ns", "-nobanner", "-norand" take no arguments (-ns
             *   does have extra parameter characters, but they have to be
             *   concatenated as part of the same argv entry, as in "-ns11") 
             */
            break;

        case 's':
            if (argv[i][2] == 'd')
            {
                /* tads 3 -sd <dir> - skip the <dir> parameter */
                ++i;
            }
            else if (argv[i][2] == '\0')
            {
                /* 
                 *   tads 2/3 "-s#" (#=0,1,2,3,4); in tads 2, the # can be
                 *   separated by a space from the -s, so we'll allow it this
                 *   way in general 
                 */
                ++i;
            }
            break;

        case 'i':
            /* tads 2/3 "-iFile" - consume an argument */
            if (argv[i][2] == '\0')
                ++i;
            break;

        case 'l':
            /* tads 2/3 "-lFile" - consume an argument */
            if (argv[i][2] == '\0')
                ++i;
            break;

        case 'o':
            /* tads 2/3 "-oFile" - consume an argument */
            if (argv[i][2] == '\0')
                ++i;
            break;

        case 'p':
            /* tads 2/3 "-plain"; tads 2 "-p[+-]" - no arguments */
            break;

        case 'R':
            /* tads 3 '-Rdir' - consume an argument */
            if (argv[i][2] == '\0')
                ++i;
            break;

        case 'r':
            /* tads 2/3 "-rFile" - consume an argument */
            if (argv[i][2] != '\0')
            {
                /* the file to be restored is appended to the "-r" */
                restore_file = argv[i] + 2;
            }
            else
            {
                /* the file to be restored is the next argument */
                ++i;
                restore_file = argv[i];
            }
            break;

        case 'X':
            /* TADS 3 special system commands */
            if (strcmp(argv[i], "-Xinterfaces") == 0)
            {
                /* 
                 *   this is a stand-alone command that doesn't require a
                 *   game file; return the engine type directly 
                 */
                strcpy_limit(buf, "", buflen);
                *engine_type = VM_GGT_TADS3;
                return TRUE;
            }
            break;

        case 'w':
            /* tads 3 -webhost, -websid */
            if (strcmp(argv[i], "-webhost") == 0
                || strcmp(argv[i], "-websid") == 0)
            {
                /* this takes an additional argument */
                ++i;
            }
            break;
        }
    }

    /*
     *   We have no more options, so the next argument is the game filename.
     *   If we're out of argv elements, then no game filename was directly
     *   specified, in which case we'll try looking for a file spec in the
     *   restore file, if present.  
     */
    if (i < argc)
    {
        /* there's a game file argument - copy it to the caller's buffer */
        strcpy_limit(buf, argv[i], buflen);

        /* return success */
        return TRUE;
    }
    else if (restore_file != 0)
    {
        /* 
         *   There's no game file argument, but there is a restore file
         *   argument.  Try identifying the game file from the original game
         *   file specification stored in the saved state file.  
         */
        return vm_get_game_file_from_savefile(restore_file, buf, buflen);
    }
    else
    {
        /* 
         *   there's no game file or restore file argument, so they've given
         *   us nothing to go on - there's no game file 
         */
        return FALSE;
    }
}